

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

LoadedFile * lf_load_keyfile_fp(FILE *fp,char **errptr)

{
  LoadFileStatus LVar1;
  LoadedFile *lf;
  int *piVar2;
  char *pcVar3;
  
  lf = (LoadedFile *)safemalloc(1,0x40,0x56555);
  lf->data = (char *)(lf + 1);
  lf->len = 0;
  lf->max_size = 0x56555;
  LVar1 = lf_load_fp(lf,fp);
  if (LVar1 != LF_OK) {
    if (LVar1 == LF_TOO_BIG) {
      pcVar3 = "file is too large to be a key file";
    }
    else {
      if (LVar1 != LF_ERROR) {
        __assert_fail("false && \"bad status value in lf_load_keyfile_helper\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                      0x75,"_Bool lf_load_keyfile_helper(LoadFileStatus, const char **)");
      }
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
    }
    if (errptr != (char **)0x0) {
      *errptr = pcVar3;
    }
    lf_free(lf);
    lf = (LoadedFile *)0x0;
  }
  return lf;
}

Assistant:

LoadedFile *lf_load_keyfile_fp(FILE *fp, const char **errptr)
{
    LoadedFile *lf = lf_new(MAX_KEY_FILE_SIZE);
    if (!lf_load_keyfile_helper(lf_load_fp(lf, fp), errptr)) {
        lf_free(lf);
        return NULL;
    }
    return lf;
}